

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void change_setup(void)

{
  _class *c;
  t_symbol *ptVar1;
  
  ptVar1 = gensym("change");
  change_class = class_new(ptVar1,change_new,(t_method)0x0,0x38,0,A_DEFFLOAT,0);
  class_addbang(change_class,change_bang);
  class_doaddfloat(change_class,change_float);
  c = change_class;
  ptVar1 = gensym("set");
  class_addmethod(c,change_set,ptVar1,A_DEFFLOAT,0);
  return;
}

Assistant:

void change_setup(void)
{
    change_class = class_new(gensym("change"), (t_newmethod)change_new, 0,
        sizeof(t_change), 0, A_DEFFLOAT, 0);
    class_addbang(change_class, change_bang);
    class_addfloat(change_class, change_float);
    class_addmethod(change_class, (t_method)change_set, gensym("set"),
        A_DEFFLOAT, 0);
}